

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

_Bool ends_with(char *str,char *suffix)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  size_t suffix_len;
  size_t str_len;
  char *suffix_local;
  char *str_local;
  
  if ((str == (char *)0x0) || (suffix == (char *)0x0)) {
    str_local._7_1_ = false;
  }
  else {
    sVar2 = strlen(str);
    __n = strlen(suffix);
    if (sVar2 < __n) {
      str_local._7_1_ = false;
    }
    else {
      iVar1 = strncmp(str + (sVar2 - __n),suffix,__n);
      str_local._7_1_ = iVar1 == 0;
    }
  }
  return str_local._7_1_;
}

Assistant:

bool
ends_with (const char *str, const char *suffix)
{
  size_t str_len;
  size_t suffix_len;

  if (unlikely (str == NULL || suffix == NULL))
    return false;

  str_len = strlen (str);
  suffix_len = strlen (suffix);

  if (suffix_len > str_len)
    return false;

  return !strncmp (str + str_len - suffix_len,
                  suffix, suffix_len);
}